

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O1

void rrot1(void *blob,int len,int c)

{
  byte *pbVar1;
  byte bVar2;
  int byte;
  uint uVar3;
  uint8_t *b;
  
  if (0 < c) {
    uVar3 = len * 8 - 1U >> 3;
    do {
      if (len < 1) {
        rshift1(blob,len,1);
LAB_00160b34:
        if ((int)uVar3 < len) {
          pbVar1 = (byte *)((long)blob + (ulong)uVar3);
          *pbVar1 = *pbVar1 & 0x7f;
        }
      }
      else {
        bVar2 = *blob;
        rshift1(blob,len,1);
        if ((bVar2 & 1) == 0) goto LAB_00160b34;
        if ((int)uVar3 < len) {
          pbVar1 = (byte *)((long)blob + (ulong)uVar3);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
      c = c + -1;
    } while (c != 0);
  }
  return;
}

Assistant:

void rrot1 ( void * blob, int len, int c )
{
  int nbits = len * 8;

  for(int i = 0; i < c; i++)
  {
    uint32_t bit = getbit(blob,len,0);

    rshift1(blob,len,1);

    setbit(blob,len,nbits-1,bit);
  }
}